

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool_test.cc
# Opt level: O2

void __thiscall TokenPoolTestImplicitToken::Run(TokenPoolTestImplicitToken *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  
  anon_unknown.dwarf_117da6::TokenPoolTest::CreateDefaultPool(&this->super_TokenPoolTest);
  bVar2 = testing::Test::Check
                    (g_current_test,(this->super_TokenPoolTest).tokens_ != (TokenPool *)0x0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
                     ,0xaf,"__null != tokens_");
  if (bVar2) {
    testing::Test::Check
              (g_current_test,(bool)(-((this->super_TokenPoolTest).load_avg_ == -1.23456789) & 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
               ,0xb0,"kLoadAverageDefault == load_avg_");
    pTVar1 = g_current_test;
    iVar3 = (*((this->super_TokenPoolTest).tokens_)->_vptr_TokenPool[2])();
    testing::Test::Check
              (pTVar1,SUB41(iVar3,0),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
               ,0xb2,"tokens_->Acquire()");
    (*((this->super_TokenPoolTest).tokens_)->_vptr_TokenPool[3])();
    pTVar1 = g_current_test;
    iVar3 = (*((this->super_TokenPoolTest).tokens_)->_vptr_TokenPool[2])();
    testing::Test::Check
              (pTVar1,(bool)((byte)iVar3 ^ 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
               ,0xb4,"tokens_->Acquire()");
    (*((this->super_TokenPoolTest).tokens_)->_vptr_TokenPool[4])();
    pTVar1 = g_current_test;
    iVar3 = (*((this->super_TokenPoolTest).tokens_)->_vptr_TokenPool[2])();
    testing::Test::Check
              (pTVar1,SUB41(iVar3,0),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
               ,0xb6,"tokens_->Acquire()");
    return;
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
}

Assistant:

TEST_F(TokenPoolTest, ImplicitToken) {
  CreateDefaultPool();

  ASSERT_NE(NULL, tokens_);
  EXPECT_EQ(kLoadAverageDefault, load_avg_);

  EXPECT_TRUE(tokens_->Acquire());
  tokens_->Reserve();
  EXPECT_FALSE(tokens_->Acquire());
  tokens_->Release();
  EXPECT_TRUE(tokens_->Acquire());
}